

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PEFile.cpp
# Opt level: O1

RICH_DANS_HEADER * __thiscall PEFile::getRichHeaderBgn(PEFile *this,RICH_SIGNATURE *richSign)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  RICH_DANS_HEADER *pRVar3;
  RICH_DANS_HEADER *pRVar4;
  long lVar5;
  bool bVar6;
  
  if (richSign == (RICH_SIGNATURE *)0x0) {
    return (RICH_DANS_HEADER *)0x0;
  }
  uVar1 = richSign->checksum;
  pRVar4 = (RICH_DANS_HEADER *)0x0;
  iVar2 = (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer.
            _vptr_AbstractByteBuffer[6])(this,richSign,0);
  if (CONCAT44(extraout_var,iVar2) != 0x18) {
    lVar5 = CONCAT44(extraout_var,iVar2) + -0x1c;
    while( true ) {
      iVar2 = (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer.
                _vptr_AbstractByteBuffer[7])(this,lVar5 + 4,0x18,0);
      pRVar4 = (RICH_DANS_HEADER *)CONCAT44(extraout_var_00,iVar2);
      if (pRVar4 == (RICH_DANS_HEADER *)0x0) break;
      if (((pRVar4->dansId ^ uVar1) == 0x536e6144) ||
         (bVar6 = lVar5 == 0, lVar5 = lVar5 + -4, bVar6)) goto LAB_00125311;
    }
    pRVar4 = (RICH_DANS_HEADER *)0x0;
  }
LAB_00125311:
  if (pRVar4 == (RICH_DANS_HEADER *)0x0) {
    pRVar3 = (RICH_DANS_HEADER *)0x0;
  }
  else {
    pRVar3 = (RICH_DANS_HEADER *)0x0;
    if ((uVar1 ^ pRVar4->dansId) == 0x536e6144) {
      pRVar3 = pRVar4;
    }
  }
  return pRVar3;
}

Assistant:

pe::RICH_DANS_HEADER* PEFile::getRichHeaderBgn(pe::RICH_SIGNATURE* richSign)
{
    if (!richSign) return NULL;

    DWORD xorkey = richSign->checksum;
    const offset_t richOffset = this->getOffset(richSign);

    pe::RICH_DANS_HEADER* dansHdr = NULL;

    offset_t offset = richOffset - sizeof(pe::RICH_DANS_HEADER);
    while (offset > 0) {
        dansHdr = (pe::RICH_DANS_HEADER*) this->getContentAt(offset, sizeof(pe::RICH_DANS_HEADER));
        if (!dansHdr) {
            break;
        }
        if (dansHdr->dansId == (pe::DANS_HDR_MAGIC ^ xorkey)) {
            break; //got it!
        }
        //walking back
        offset -= sizeof(DWORD);
    }
    if (!dansHdr || dansHdr->dansId != (pe::DANS_HDR_MAGIC ^ xorkey)) {
        return NULL; //not found
    }
    return dansHdr;
}